

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordDict.h
# Opt level: O0

void __thiscall HashDict::insert(HashDict *this,string *word)

{
  bool bVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  reference pvVar4;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_28;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_20;
  string *local_18;
  string *word_local;
  HashDict *this_local;
  
  local_18 = word;
  word_local = (string *)this;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find(&this->word2idx,word);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::end(&this->word2idx);
  bVar1 = std::__detail::operator==(&local_20,&local_28);
  if (bVar1) {
    sVar2 = std::vector<Word,_std::allocator<Word>_>::size(&(this->super_WordDict).vocab);
    pmVar3 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&this->word2idx,local_18);
    *pmVar3 = (mapped_type)sVar2;
    std::vector<Word,std::allocator<Word>>::emplace_back<std::__cxx11::string&>
              ((vector<Word,std::allocator<Word>> *)&(this->super_WordDict).vocab,local_18);
  }
  else {
    pmVar3 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&this->word2idx,local_18);
    pvVar4 = std::vector<Word,_std::allocator<Word>_>::operator[]
                       (&(this->super_WordDict).vocab,(long)*pmVar3);
    pvVar4->count = pvVar4->count + 1;
  }
  return;
}

Assistant:

void HashDict::insert(std::string &&word)
{
    if (word2idx.find(word) == word2idx.end())
    {
        word2idx[word] = vocab.size();
        vocab.emplace_back(word);
    } else
    {
        vocab[word2idx[word]].count++;
    }
}